

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LookUpTableQuantizationParams * __thiscall
CoreML::Specification::QuantizationParams::mutable_lookuptablequantization(QuantizationParams *this)

{
  LinearQuantizationParams *this_00;
  
  if (this->_oneof_case_[0] == 0x66) {
    this_00 = (this->QuantizationType_).linearquantization_;
  }
  else {
    clear_QuantizationType(this);
    this->_oneof_case_[0] = 0x66;
    this_00 = (LinearQuantizationParams *)operator_new(0x28);
    LookUpTableQuantizationParams::LookUpTableQuantizationParams
              ((LookUpTableQuantizationParams *)this_00);
    (this->QuantizationType_).lookuptablequantization_ = (LookUpTableQuantizationParams *)this_00;
  }
  return (LookUpTableQuantizationParams *)this_00;
}

Assistant:

inline ::CoreML::Specification::LookUpTableQuantizationParams* QuantizationParams::mutable_lookuptablequantization() {
  if (!has_lookuptablequantization()) {
    clear_QuantizationType();
    set_has_lookuptablequantization();
    QuantizationType_.lookuptablequantization_ = new ::CoreML::Specification::LookUpTableQuantizationParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.QuantizationParams.lookupTableQuantization)
  return QuantizationType_.lookuptablequantization_;
}